

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_kalman_predict_I(double *S,double *Q,size_t n,size_t m)

{
  long lVar1;
  size_t k1;
  size_t j;
  size_t k0;
  size_t i;
  size_t m_local;
  size_t n_local;
  double *Q_local;
  double *S_local;
  
  fsnav_linal_uuT(S,S,n);
  for (k0 = 0; k0 < m; k0 = k0 + 1) {
    for (k1 = 0; k1 < m - k0; k1 = k1 + 1) {
      lVar1 = (k0 * ((n * 2 - k0) + 1) >> 1) + k1;
      S[lVar1] = Q[(k0 * ((m * 2 - k0) + 1) >> 1) + k1] + S[lVar1];
    }
  }
  fsnav_linal_chol(S,S,n);
  return;
}

Assistant:

void fsnav_linal_kalman_predict_I(double* S, double* Q, const size_t n, const size_t m)
{
	size_t i, k0, j, k1;

	fsnav_linal_uuT(S, S, n);      // P = S*S^T
	for (i = 0; i < m; i++) {
		k0 = i*(2*n-i+1)/2;
		k1 = i*(2*m-i+1)/2;
		for (j = 0; j < m-i; j++)
			S[k0+j] += Q[k1+j];   // P = P + [Q 0; 0 0]
	}
	fsnav_linal_chol(S, S, n);     // P = S*S^T
}